

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int buffer_ready_for_writing(trico_archive *arch,uint64_t bytes_needed)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  long lVar4;
  uint8_t *puVar5;
  uint64_t buff_diff;
  uint64_t extra_size;
  uint64_t bytes_needed_local;
  trico_archive *arch_local;
  
  if (arch->writable == 0) {
    arch_local._4_4_ = 0;
  }
  else {
    iVar3 = sufficient_buffer_available(arch,bytes_needed);
    if (iVar3 == 0) {
      lVar4 = bytes_needed - arch->size_available;
      puVar1 = arch->buffer_pointer;
      puVar2 = arch->buffer;
      puVar5 = (uint8_t *)trico_realloc(arch->buffer,arch->buffer_size + lVar4);
      arch->buffer = puVar5;
      if (arch->buffer == (uint8_t *)0x0) {
        return 0;
      }
      arch->buffer_pointer = puVar1 + ((long)arch->buffer - (long)puVar2);
      arch->buffer_size = lVar4 + arch->buffer_size;
      arch->size_available = lVar4 + arch->size_available;
    }
    arch_local._4_4_ = 1;
  }
  return arch_local._4_4_;
}

Assistant:

static int buffer_ready_for_writing(struct trico_archive* arch, uint64_t bytes_needed)
  {
  if (!arch->writable)
    return 0;
  if (sufficient_buffer_available(arch, bytes_needed) == 0)
    {
    uint64_t extra_size = bytes_needed - arch->size_available;
    uint64_t buff_diff = arch->buffer_pointer - arch->buffer;
    arch->buffer = (uint8_t*)trico_realloc(arch->buffer, arch->buffer_size + extra_size);
    if (arch->buffer == NULL)
      return 0;
    arch->buffer_pointer = arch->buffer + buff_diff;
    arch->buffer_size += extra_size;
    arch->size_available += extra_size;
    }
  return 1;
  }